

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall del_file::~del_file(del_file *this)

{
  del_file *this_local;
  
  (this->super_action)._vptr_action = (_func_int **)&PTR__del_file_0019c7b8;
  std::__cxx11::string::~string((string *)&this->_romname);
  std::__cxx11::string::~string((string *)&this->_fsname);
  action::~action(&this->super_action);
  return;
}

Assistant:

virtual ~del_file() { }